

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp
# Opt level: O2

void __thiscall
DGRSubgraphMiningComputeAntecedentPatternFromPattern_two_isolated_nodes_Test::TestBody
          (DGRSubgraphMiningComputeAntecedentPatternFromPattern_two_isolated_nodes_Test *this)

{
  char *pcVar1;
  initializer_list<std::array<int,_10UL>_> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<std::array<int,_10UL>_> __l_03;
  AssertHelper AStack_1f8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  AssertionResult gtest_ar;
  _Vector_base<int,_std::allocator<int>_> local_1d8;
  vector<int,_std::allocator<int>_> antecedent_pattern_node_labels_ADDED;
  vector<int,_std::allocator<int>_> antecedent_pattern_node_id_ADDED;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
  antecedent_pattern_edges_ADDED;
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_id;
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_changetime;
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_labels;
  undefined1 local_f8 [16];
  pointer local_e8;
  int aiStack_e0 [6];
  _Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_c8;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> antecedent_pattern_edges;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
  antecedent_pattern_edges_ADDED_ground_truth;
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_id_ground_truth;
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_changetime_ground_truth;
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_labels_ground_truth;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> pattern_edge_list;
  
  local_e8 = (pointer)0x6500000000;
  aiStack_e0[0] = 0;
  aiStack_e0[1] = 0x1e;
  local_f8._0_8_ = (pointer)0x100000000;
  local_f8._8_8_ = (pointer)0xfffffff600000014;
  aiStack_e0[2] = -0xf;
  aiStack_e0[3] = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_f8;
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
            (&pattern_edge_list,__l,(allocator_type *)&antecedent_pattern_edges);
  antecedent_pattern_edges.
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  antecedent_pattern_isolated_node_labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  antecedent_pattern_edges.
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  antecedent_pattern_edges.
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  antecedent_pattern_isolated_node_changetime.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  antecedent_pattern_isolated_node_labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  antecedent_pattern_isolated_node_labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  antecedent_pattern_isolated_node_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  antecedent_pattern_isolated_node_changetime.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  antecedent_pattern_isolated_node_changetime.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  antecedent_pattern_edges_ADDED.
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  antecedent_pattern_isolated_node_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  antecedent_pattern_isolated_node_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  antecedent_pattern_node_id_ADDED.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  antecedent_pattern_edges_ADDED.
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  antecedent_pattern_edges_ADDED.
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  antecedent_pattern_node_labels_ADDED.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  antecedent_pattern_node_id_ADDED.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  antecedent_pattern_node_id_ADDED.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  antecedent_pattern_node_labels_ADDED.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  antecedent_pattern_node_labels_ADDED.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._0_8_ = (pointer)0x1e00000014;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_f8;
  std::vector<int,_std::allocator<int>_>::vector
            (&antecedent_pattern_isolated_node_labels_ground_truth,__l_00,
             (allocator_type *)&antecedent_pattern_isolated_node_changetime_ground_truth);
  local_f8._0_8_ = (pointer)0xfffffff1fffffff6;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_f8;
  std::vector<int,_std::allocator<int>_>::vector
            (&antecedent_pattern_isolated_node_changetime_ground_truth,__l_01,
             (allocator_type *)&antecedent_pattern_isolated_node_id_ground_truth);
  local_f8._0_8_ = (pointer)0x100000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_f8;
  std::vector<int,_std::allocator<int>_>::vector
            (&antecedent_pattern_isolated_node_id_ground_truth,__l_02,
             (allocator_type *)&antecedent_pattern_edges_ADDED_ground_truth);
  local_e8 = (pointer)0x6500000000;
  aiStack_e0[0] = 0;
  aiStack_e0[1] = 0x1e;
  local_f8._0_8_ = (pointer)0x100000000;
  local_f8._8_8_ = (pointer)0xfffffff600000014;
  aiStack_e0[2] = -0xf;
  aiStack_e0[3] = 0;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_f8;
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
            (&antecedent_pattern_edges_ADDED_ground_truth,__l_03,(allocator_type *)&local_1d8);
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dgrminer::compute_antecedent_pattern_from_pattern
            (&pattern_edge_list,&antecedent_pattern_edges,&antecedent_pattern_isolated_node_labels,
             &antecedent_pattern_isolated_node_changetime,&antecedent_pattern_isolated_node_id,
             &antecedent_pattern_edges_ADDED,&antecedent_pattern_node_id_ADDED,
             &antecedent_pattern_node_labels_ADDED);
  testing::internal::
  CmpHelperEQ<std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>,std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>>
            ((internal *)&gtest_ar,"antecedent_pattern_edges",
             "antecedent_pattern_edges_ground_truth",&antecedent_pattern_edges,
             (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
               ,0x5d,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_1f8,(Message *)&local_1f0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::
    CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              ((internal *)&gtest_ar,"antecedent_pattern_isolated_node_labels",
               "antecedent_pattern_isolated_node_labels_ground_truth",
               &antecedent_pattern_isolated_node_labels,
               &antecedent_pattern_isolated_node_labels_ground_truth);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_1f0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_1f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                 ,0x5e,pcVar1);
      testing::internal::AssertHelper::operator=(&AStack_1f8,(Message *)&local_1f0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::
      CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                ((internal *)&gtest_ar,"antecedent_pattern_isolated_node_changetime",
                 "antecedent_pattern_isolated_node_changetime_ground_truth",
                 &antecedent_pattern_isolated_node_changetime,
                 &antecedent_pattern_isolated_node_changetime_ground_truth);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_1f0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_1f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                   ,0x5f,pcVar1);
        testing::internal::AssertHelper::operator=(&AStack_1f8,(Message *)&local_1f0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        testing::internal::
        CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                  ((internal *)&gtest_ar,"antecedent_pattern_isolated_node_id",
                   "antecedent_pattern_isolated_node_id_ground_truth",
                   &antecedent_pattern_isolated_node_id,
                   &antecedent_pattern_isolated_node_id_ground_truth);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_1f0);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_1f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                     ,0x60,pcVar1);
          testing::internal::AssertHelper::operator=(&AStack_1f8,(Message *)&local_1f0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          testing::internal::
          CmpHelperEQ<std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>,std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>>
                    ((internal *)&gtest_ar,"antecedent_pattern_edges_ADDED",
                     "antecedent_pattern_edges_ADDED_ground_truth",&antecedent_pattern_edges_ADDED,
                     &antecedent_pattern_edges_ADDED_ground_truth);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_1f0);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_1f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                       ,0x61,pcVar1);
            testing::internal::AssertHelper::operator=(&AStack_1f8,(Message *)&local_1f0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            testing::internal::
            CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                      ((internal *)&gtest_ar,"antecedent_pattern_node_id_ADDED",
                       "antecedent_pattern_node_id_ADDED_ground_truth",
                       &antecedent_pattern_node_id_ADDED,
                       (vector<int,_std::allocator<int>_> *)local_f8);
            if (gtest_ar.success_ != false) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              testing::internal::
              CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                        ((internal *)&gtest_ar,"antecedent_pattern_node_labels_ADDED",
                         "antecedent_pattern_node_labels_ADDED_ground_truth",
                         &antecedent_pattern_node_labels_ADDED,
                         (vector<int,_std::allocator<int>_> *)&local_1d8);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_1f0);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&AStack_1f8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                           ,99,pcVar1);
                testing::internal::AssertHelper::operator=(&AStack_1f8,(Message *)&local_1f0);
                testing::internal::AssertHelper::~AssertHelper(&AStack_1f8);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&local_1f0);
              }
              goto LAB_0010ef43;
            }
            testing::Message::Message((Message *)&local_1f0);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_1f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                       ,0x62,pcVar1);
            testing::internal::AssertHelper::operator=(&AStack_1f8,(Message *)&local_1f0);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_1f8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_1f0);
LAB_0010ef43:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_f8);
  std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~_Vector_base
            (&antecedent_pattern_edges_ADDED_ground_truth.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&antecedent_pattern_isolated_node_id_ground_truth.
              super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&antecedent_pattern_isolated_node_changetime_ground_truth.
              super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&antecedent_pattern_isolated_node_labels_ground_truth.
              super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~_Vector_base
            (&local_c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&antecedent_pattern_node_labels_ADDED.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&antecedent_pattern_node_id_ADDED.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~_Vector_base
            (&antecedent_pattern_edges_ADDED.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&antecedent_pattern_isolated_node_id.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&antecedent_pattern_isolated_node_changetime.
              super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&antecedent_pattern_isolated_node_labels.super__Vector_base<int,_std::allocator<int>_>)
  ;
  std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~_Vector_base
            (&antecedent_pattern_edges.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>);
  std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~_Vector_base
            (&pattern_edge_list.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>);
  return;
}

Assistant:

TEST(DGRSubgraphMiningComputeAntecedentPatternFromPattern, two_isolated_nodes)
{
    std::vector<std::array<int, PAT___SIZE>> pattern_edge_list = {
            {0, 1, 20, -10, 0, 101, 0, 30, -15, 0}
    };


    std::vector<std::array<int, 10>> antecedent_pattern_edges;
    std::vector<int> antecedent_pattern_isolated_node_labels;
    std::vector<int> antecedent_pattern_isolated_node_changetime;
    std::vector<int> antecedent_pattern_isolated_node_id;
    std::vector<std::array<int, 10>> antecedent_pattern_edges_ADDED;
    std::vector<int> antecedent_pattern_node_id_ADDED;
    std::vector<int> antecedent_pattern_node_labels_ADDED;

    std::vector<std::array<int, 10>> antecedent_pattern_edges_ground_truth = {};
    std::vector<int> antecedent_pattern_isolated_node_labels_ground_truth = {20, 30};
    std::vector<int> antecedent_pattern_isolated_node_changetime_ground_truth = {-10, -15};
    std::vector<int> antecedent_pattern_isolated_node_id_ground_truth = {0 ,1};
    std::vector<std::array<int, 10>> antecedent_pattern_edges_ADDED_ground_truth = {{0, 1, 20, -10, 0, 101, 0, 30, -15, 0}};
    std::vector<int> antecedent_pattern_node_id_ADDED_ground_truth = {};
    std::vector<int> antecedent_pattern_node_labels_ADDED_ground_truth = {};


    compute_antecedent_pattern_from_pattern(pattern_edge_list, antecedent_pattern_edges,
                                            antecedent_pattern_isolated_node_labels,
                                            antecedent_pattern_isolated_node_changetime,
                                            antecedent_pattern_isolated_node_id, antecedent_pattern_edges_ADDED,
                                            antecedent_pattern_node_id_ADDED,
                                            antecedent_pattern_node_labels_ADDED);

    ASSERT_EQ(antecedent_pattern_edges, antecedent_pattern_edges_ground_truth);
    ASSERT_EQ(antecedent_pattern_isolated_node_labels, antecedent_pattern_isolated_node_labels_ground_truth);
    ASSERT_EQ(antecedent_pattern_isolated_node_changetime, antecedent_pattern_isolated_node_changetime_ground_truth);
    ASSERT_EQ(antecedent_pattern_isolated_node_id, antecedent_pattern_isolated_node_id_ground_truth);
    ASSERT_EQ(antecedent_pattern_edges_ADDED, antecedent_pattern_edges_ADDED_ground_truth);
    ASSERT_EQ(antecedent_pattern_node_id_ADDED, antecedent_pattern_node_id_ADDED_ground_truth);
    ASSERT_EQ(antecedent_pattern_node_labels_ADDED, antecedent_pattern_node_labels_ADDED_ground_truth);
}